

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Mode __thiscall
Catch::Clara::Parser::handlePositional
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  long lVar1;
  string local_78 [8];
  string data;
  undefined8 local_50;
  undefined2 local_48 [12];
  
  if (this->inQuotes == false) {
    data.field_2._8_8_ = local_48;
    local_48[0] = 0;
    local_50 = 1;
    lVar1 = std::__cxx11::string::find((char)&data + '\x18',(ulong)(uint)(int)c);
    std::__cxx11::string::~string((string *)(data.field_2._M_local_buf + 8));
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)local_78,(ulong)arg);
      data.field_2._8_8_ = data.field_2._8_8_ & 0xffffffff00000000;
      std::__cxx11::string::string((string *)&local_50,local_78);
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)((long)&data.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string(local_78);
      return None;
    }
  }
  return this->mode;
}

Assistant:

Mode handlePositional(std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens) {
			if (inQuotes || std::string("\0", 1).find(c) == std::string::npos)
				return mode;

			std::string data = arg.substr(from, i - from);
			tokens.push_back(Token(Token::Positional, data));
			return None;
		}